

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::ls_solver::initialize_variable_datas(ls_solver *this)

{
  pointer pvVar1;
  pointer plVar2;
  pointer pcVar3;
  pointer pcVar4;
  long lVar5;
  undefined8 in_RAX;
  ulong uVar6;
  longlong *plVar7;
  ulong uVar8;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  pointer plVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  undefined8 uStack_38;
  
  pvVar1 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = this->_num_vars;
  uVar8 = 1;
  do {
    if (uVar6 < uVar8) {
      plVar7 = &(this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
                _M_impl.super__Vector_impl_data._M_start[1].last_flip_step;
      uVar8 = uVar6;
      while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
        *plVar7 = 0;
        plVar7 = plVar7 + 9;
      }
      lVar10 = 0x8d;
      uStack_38 = in_RAX;
      for (uVar8 = 1;
          pvVar1 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar8 <= uVar6; uVar8 = uVar8 + 1) {
        *(undefined1 *)((long)pvVar1 + lVar10 + -1) = 1;
        bVar12 = 0 < *(long *)((long)pvVar1 + lVar10 + -0x15);
        if (bVar12) {
          uStack_38 = CONCAT44((int)uVar8,(undefined4)uStack_38);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&this->_ccd_vars,(int *)((long)&uStack_38 + 4));
          uVar6 = this->_num_vars;
        }
        *(bool *)((long)&(pvVar1->literals).
                         super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + lVar10)
             = bVar12;
        lVar10 = lVar10 + 0x48;
      }
      pvVar1->cc_value = false;
      pvVar1->is_in_ccd_vars = false;
      pvVar1->score = 0;
      pvVar1->last_flip_step = 0;
      return;
    }
    pvVar1[uVar8].score = 0;
    plVar2 = *(pointer *)
              ((long)&pvVar1[uVar8].literals.
                      super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
    pcVar3 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar4 = (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    for (plVar9 = *(pointer *)
                   &pvVar1[uVar8].literals.super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>
                    ._M_impl; plVar9 != plVar2; plVar9 = plVar9 + 1) {
      iVar11 = (int)*(uint *)plVar9 >> 1;
      if (pcVar3[iVar11].sat_count == 1) {
        if ((*(uint *)plVar9 & 1) == (int)pcVar4[plVar9->var_num]) {
          lVar5 = -pcVar3[iVar11].weight;
          goto LAB_0012b182;
        }
      }
      else if (pcVar3[iVar11].sat_count == 0) {
        lVar5 = pcVar3[iVar11].weight;
LAB_0012b182:
        lVar10 = lVar10 + lVar5;
        pvVar1[uVar8].score = lVar10;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void ls_solver::initialize_variable_datas()
{
    size_t v, c;
    variable *vp;
    // scores
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->score = 0;
        for (lit l : vp->literals) {
            c = l.clause_num;
            if (0 == _clauses[c].sat_count) {
                vp->score += _clauses[c].weight;
            } else if (1 == _clauses[c].sat_count && l.sense == _solution[l.var_num]) {
                vp->score -= _clauses[c].weight;
            }
        }
    }
    // last flip step
    for (v = 1; v <= _num_vars; v++) {
        _vars[v].last_flip_step = 0;
    }
    // cc datas
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->cc_value = 1;
        if (vp->score > 0) //&&_vars[v].cc_value==1
        {
            _ccd_vars.push_back(v);
            vp->is_in_ccd_vars = 1;
        } else {
            vp->is_in_ccd_vars = 0;
        }
    }
    // the virtual var 0
    vp = &(_vars[0]);
    vp->score = 0;
    vp->cc_value = 0;
    vp->is_in_ccd_vars = 0;
    vp->last_flip_step = 0;
}